

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall Assimp::ASEImporter::BuildMaterialIndices(ASEImporter *this)

{
  uint *puVar1;
  Material *mat;
  pointer pMVar2;
  aiScene *paVar3;
  aiMesh *paVar4;
  long lVar5;
  aiMaterial *paVar6;
  uint iMesh;
  aiMaterial **ppaVar7;
  ulong uVar8;
  long lVar9;
  aiColor4D *paVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  if (this->pcScene == (aiScene *)0x0) {
    __assert_fail("__null != pcScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                  ,0x4cb,"void Assimp::ASEImporter::BuildMaterialIndices()");
  }
  uVar13 = 0;
  while( true ) {
    uVar8 = (ulong)uVar13;
    pMVar2 = (this->mParser->m_vMaterials).
             super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->mParser->m_vMaterials).
                       super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x2e0) <= uVar8)
    break;
    mat = pMVar2 + uVar8;
    if (pMVar2[uVar8].bNeed == true) {
      ConvertMaterial(this,mat);
      puVar1 = &this->pcScene->mNumMaterials;
      *puVar1 = *puVar1 + 1;
    }
    uVar12 = 0;
    while( true ) {
      uVar8 = (ulong)uVar12;
      pMVar2 = (mat->avSubMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(mat->avSubMaterials).
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x2e0) <=
          uVar8) break;
      if (pMVar2[uVar8].bNeed == true) {
        ConvertMaterial(this,pMVar2 + uVar8);
        puVar1 = &this->pcScene->mNumMaterials;
        *puVar1 = *puVar1 + 1;
      }
      uVar12 = uVar12 + 1;
    }
    uVar13 = uVar13 + 1;
  }
  paVar3 = this->pcScene;
  ppaVar7 = (aiMaterial **)operator_new__((ulong)paVar3->mNumMaterials << 3);
  paVar3->mMaterials = ppaVar7;
  uVar13 = 0;
  uVar12 = 0;
  do {
    paVar10 = (aiColor4D *)(ulong)uVar13;
    pMVar2 = (this->mParser->m_vMaterials).
             super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((aiColor4D *)
        (((long)(this->mParser->m_vMaterials).
                super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x2e0) <= paVar10) {
      return;
    }
    if (pMVar2[(long)paVar10].bNeed == true) {
      if (pMVar2[(long)paVar10].pcInstance == (aiMaterial *)0x0) {
        __assert_fail("__null != mat.pcInstance",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                      ,0x4ea,"void Assimp::ASEImporter::BuildMaterialIndices()");
      }
      this->pcScene->mMaterials[uVar12] = pMVar2[(long)paVar10].pcInstance;
      for (uVar8 = 0; uVar8 < this->pcScene->mNumMeshes; uVar8 = uVar8 + 1) {
        paVar4 = this->pcScene->mMeshes[uVar8];
        if ((paVar4->mMaterialIndex == 0xffffffff) && (paVar10 == paVar4->mColors[3])) {
          paVar4->mMaterialIndex = uVar12;
          paVar4->mColors[3] = (aiColor4D *)0x0;
        }
      }
      uVar12 = uVar12 + 1;
    }
    uVar11 = 0;
    while( true ) {
      lVar5 = *(long *)&pMVar2[(long)paVar10].avSubMaterials.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pMVar2[(long)paVar10].avSubMaterials.
                                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                  ._M_impl + 8) - lVar5) / 0x2e0) <= (ulong)uVar11) break;
      lVar9 = (ulong)uVar11 * 0x2e0;
      if (*(char *)(lVar5 + 0x2d8 + lVar9) == '\x01') {
        paVar6 = *(aiMaterial **)(lVar5 + lVar9 + 0x2d0);
        if (paVar6 == (aiMaterial *)0x0) {
          __assert_fail("__null != submat.pcInstance",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                        ,0x501,"void Assimp::ASEImporter::BuildMaterialIndices()");
        }
        this->pcScene->mMaterials[uVar12] = paVar6;
        for (uVar8 = 0; uVar8 < this->pcScene->mNumMeshes; uVar8 = uVar8 + 1) {
          paVar4 = this->pcScene->mMeshes[uVar8];
          if ((uVar11 == paVar4->mMaterialIndex) && (paVar10 == paVar4->mColors[3])) {
            paVar4->mMaterialIndex = uVar12;
            paVar4->mColors[3] = (aiColor4D *)0x0;
          }
        }
        uVar12 = uVar12 + 1;
      }
      uVar11 = uVar11 + 1;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void ASEImporter::BuildMaterialIndices()
{
    ai_assert(NULL != pcScene);

    // iterate through all materials and check whether we need them
    for (unsigned int iMat = 0; iMat < mParser->m_vMaterials.size();++iMat)
    {
        ASE::Material& mat = mParser->m_vMaterials[iMat];
        if (mat.bNeed)  {
            // Convert it to the aiMaterial layout
            ConvertMaterial(mat);
            ++pcScene->mNumMaterials;
        }
        for (unsigned int iSubMat = 0; iSubMat < mat.avSubMaterials.size();++iSubMat)
        {
            ASE::Material& submat = mat.avSubMaterials[iSubMat];
            if (submat.bNeed)   {
                // Convert it to the aiMaterial layout
                ConvertMaterial(submat);
                ++pcScene->mNumMaterials;
            }
        }
    }

    // allocate the output material array
    pcScene->mMaterials = new aiMaterial*[pcScene->mNumMaterials];
    D3DS::Material** pcIntMaterials = new D3DS::Material*[pcScene->mNumMaterials];

    unsigned int iNum = 0;
    for (unsigned int iMat = 0; iMat < mParser->m_vMaterials.size();++iMat) {
        ASE::Material& mat = mParser->m_vMaterials[iMat];
        if (mat.bNeed)
        {
            ai_assert(NULL != mat.pcInstance);
            pcScene->mMaterials[iNum] = mat.pcInstance;

            // Store the internal material, too
            pcIntMaterials[iNum] = &mat;

            // Iterate through all meshes and search for one which is using
            // this top-level material index
            for (unsigned int iMesh = 0; iMesh < pcScene->mNumMeshes;++iMesh)
            {
                aiMesh* mesh = pcScene->mMeshes[iMesh];
                if (ASE::Face::DEFAULT_MATINDEX == mesh->mMaterialIndex &&
                    iMat == (uintptr_t)mesh->mColors[3])
                {
                    mesh->mMaterialIndex = iNum;
                    mesh->mColors[3] = NULL;
                }
            }
            iNum++;
        }
        for (unsigned int iSubMat = 0; iSubMat < mat.avSubMaterials.size();++iSubMat)   {
            ASE::Material& submat = mat.avSubMaterials[iSubMat];
            if (submat.bNeed)   {
                ai_assert(NULL != submat.pcInstance);
                pcScene->mMaterials[iNum] = submat.pcInstance;

                // Store the internal material, too
                pcIntMaterials[iNum] = &submat;

                // Iterate through all meshes and search for one which is using
                // this sub-level material index
                for (unsigned int iMesh = 0; iMesh < pcScene->mNumMeshes;++iMesh)   {
                    aiMesh* mesh = pcScene->mMeshes[iMesh];

                    if (iSubMat == mesh->mMaterialIndex && iMat == (uintptr_t)mesh->mColors[3]) {
                        mesh->mMaterialIndex = iNum;
                        mesh->mColors[3]     = NULL;
                    }
                }
                iNum++;
            }
        }
    }

    // Delete our temporary array
    delete[] pcIntMaterials;
}